

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_list.c
# Opt level: O0

void adt_u32List_insert_after(adt_u32List_t *self,adt_u32List_elem_t *pIter,uint32_t item)

{
  adt_u32List_elem_t *paVar1;
  adt_u32List_elem_t *pElem;
  uint32_t item_local;
  adt_u32List_elem_t *pIter_local;
  adt_u32List_t *self_local;
  
  if (((self != (adt_u32List_t *)0x0) && (pIter != (adt_u32List_elem_t *)0x0)) &&
     (paVar1 = adt_u32List_elem_new(item,pIter->pNext,pIter), paVar1 != (adt_u32List_elem_t *)0x0))
  {
    if (pIter->pNext != (adt_u32List_elem_tag *)0x0) {
      pIter->pNext->pPrev = paVar1;
    }
    pIter->pNext = paVar1;
    if (pIter == self->pLast) {
      self->pLast = paVar1;
    }
  }
  return;
}

Assistant:

void adt_u32List_insert_after(adt_u32List_t *self, adt_u32List_elem_t *pIter, uint32_t item)
{
   if( (self != 0) && (pIter != 0) )
   {
      adt_u32List_elem_t *pElem = adt_u32List_elem_new(item,pIter->pNext, pIter);
      if (pElem != 0)
      {
         if (pIter->pNext != 0)
         {
            pIter->pNext->pPrev = pElem;
         }
         pIter->pNext = pElem;
         //adjust pLast in case we are inserting at end of list
         if (pIter == self->pLast)
         {
            self->pLast = pElem;
         }
      }
   }
}